

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O0

mat4 * __thiscall rengine::mat4::operator*(mat4 *__return_storage_ptr__,mat4 *this,mat4 o)

{
  mat4 *this_local;
  
  if ((this->type == 1) && (o.type == 1)) {
    mat4(__return_storage_ptr__,1.0,0.0,0.0,this->m[3] + o.m[3],0.0,1.0,0.0,this->m[7] + o.m[7],0.0,
         0.0,1.0,0.0,0.0,0.0,0.0,1.0,1);
  }
  else if (this->type == 1) {
    mat4(__return_storage_ptr__,this->m[3] * o.m[0xc] + o.m[0],this->m[3] * o.m[0xd] + o.m[1],
         this->m[3] * o.m[0xe] + o.m[2],this->m[3] * o.m[0xf] + o.m[3],
         this->m[7] * o.m[0xc] + o.m[4],this->m[7] * o.m[0xd] + o.m[5],
         this->m[7] * o.m[0xe] + o.m[6],this->m[7] * o.m[0xf] + o.m[7],o.m[8],o.m[9],o.m[10],
         o.m[0xb],o.m[0xc],o.m[0xd],o.m[0xe],o.m[0xf],this->type | o.type);
  }
  else if (o.type == 1) {
    mat4(__return_storage_ptr__,this->m[0],this->m[1],this->m[2],
         this->m[0] * o.m[3] + this->m[1] * o.m[7] + this->m[3],this->m[4],this->m[5],this->m[6],
         this->m[4] * o.m[3] + this->m[5] * o.m[7] + this->m[7],this->m[8],this->m[9],this->m[10],
         this->m[8] * o.m[3] + this->m[9] * o.m[7] + this->m[0xb],this->m[0xc],this->m[0xd],
         this->m[0xe],this->m[0xc] * o.m[3] + this->m[0xd] * o.m[7] + this->m[0xf],this->type | 1);
  }
  else if ((this->type < 8) && (o.type < 8)) {
    mat4(__return_storage_ptr__,this->m[0] * o.m[0] + this->m[1] * o.m[4],
         this->m[0] * o.m[1] + this->m[1] * o.m[5],0.0,
         this->m[0] * o.m[3] + this->m[1] * o.m[7] + this->m[3],
         this->m[4] * o.m[0] + this->m[5] * o.m[4],this->m[4] * o.m[1] + this->m[5] * o.m[5],0.0,
         this->m[4] * o.m[3] + this->m[5] * o.m[7] + this->m[7],0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0,
         this->type | o.type);
  }
  else {
    mat4(__return_storage_ptr__,
         this->m[3] * o.m[0xc] + this->m[2] * o.m[8] + this->m[0] * o.m[0] + this->m[1] * o.m[4],
         this->m[3] * o.m[0xd] + this->m[2] * o.m[9] + this->m[0] * o.m[1] + this->m[1] * o.m[5],
         this->m[3] * o.m[0xe] + this->m[2] * o.m[10] + this->m[0] * o.m[2] + this->m[1] * o.m[6],
         this->m[3] * o.m[0xf] + this->m[2] * o.m[0xb] + this->m[0] * o.m[3] + this->m[1] * o.m[7],
         this->m[7] * o.m[0xc] + this->m[6] * o.m[8] + this->m[4] * o.m[0] + this->m[5] * o.m[4],
         this->m[7] * o.m[0xd] + this->m[6] * o.m[9] + this->m[4] * o.m[1] + this->m[5] * o.m[5],
         this->m[7] * o.m[0xe] + this->m[6] * o.m[10] + this->m[4] * o.m[2] + this->m[5] * o.m[6],
         this->m[7] * o.m[0xf] + this->m[6] * o.m[0xb] + this->m[4] * o.m[3] + this->m[5] * o.m[7],
         this->m[0xb] * o.m[0xc] + this->m[10] * o.m[8] + this->m[8] * o.m[0] + this->m[9] * o.m[4],
         this->m[0xb] * o.m[0xd] + this->m[10] * o.m[9] + this->m[8] * o.m[1] + this->m[9] * o.m[5],
         this->m[0xb] * o.m[0xe] + this->m[10] * o.m[10] + this->m[8] * o.m[2] + this->m[9] * o.m[6]
         ,this->m[0xb] * o.m[0xf] +
          this->m[10] * o.m[0xb] + this->m[8] * o.m[3] + this->m[9] * o.m[7],
         this->m[0xf] * o.m[0xc] +
         this->m[0xe] * o.m[8] + this->m[0xc] * o.m[0] + this->m[0xd] * o.m[4],
         this->m[0xf] * o.m[0xd] +
         this->m[0xe] * o.m[9] + this->m[0xc] * o.m[1] + this->m[0xd] * o.m[5],
         this->m[0xf] * o.m[0xe] +
         this->m[0xe] * o.m[10] + this->m[0xc] * o.m[2] + this->m[0xd] * o.m[6],
         this->m[0xf] * o.m[0xf] +
         this->m[0xe] * o.m[0xb] + this->m[0xc] * o.m[3] + this->m[0xd] * o.m[7],this->type | o.type
        );
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 operator*(mat4 o) const {

        if (type == Translation2D && o.type == Translation2D) {
            return mat4(1, 0, 0, m[3]+o.m[3],
                        0, 1, 0, m[7]+o.m[7],
                        0, 0, 1, 0,
                        0, 0, 0, 1,
                        Translation2D);

        } else if (type == Translation2D) {
            return mat4(o.m[ 0] + m[ 3] * o.m[12],
                        o.m[ 1] + m[ 3] * o.m[13],
                        o.m[ 2] + m[ 3] * o.m[14],
                        o.m[ 3] + m[ 3] * o.m[15],
                        o.m[ 4] + m[ 7] * o.m[12],
                        o.m[ 5] + m[ 7] * o.m[13],
                        o.m[ 6] + m[ 7] * o.m[14],
                        o.m[ 7] + m[ 7] * o.m[15],
                        o.m[ 8],
                        o.m[ 9],
                        o.m[10],
                        o.m[11],
                        o.m[12],
                        o.m[13],
                        o.m[14],
                        o.m[15],
                        type | o.type);

        } else if (o.type == Translation2D) {
            return mat4(m[ 0], m[ 1], m[ 2], m[ 0] * o.m[3] + m[ 1] * o.m[7] + m[ 3],
                        m[ 4], m[ 5], m[ 6], m[ 4] * o.m[3] + m[ 5] * o.m[7] + m[ 7],
                        m[ 8], m[ 9], m[10], m[ 8] * o.m[3] + m[ 9] * o.m[7] + m[11],
                        m[12], m[13], m[14], m[12] * o.m[3] + m[13] * o.m[7] + m[15],
                        Type(type | o.type));

        } else if (type <= ScaleAndRotate2D && o.type <= ScaleAndRotate2D) {
            return mat4(m[ 0] * o.m[0] + m[ 1] * o.m[4],
                        m[ 0] * o.m[1] + m[ 1] * o.m[5],
                        0,
                        m[ 0] * o.m[3] + m[ 1] * o.m[7] + m[ 3],

                        m[ 4] * o.m[0] + m[ 5] * o.m[4],
                        m[ 4] * o.m[1] + m[ 5] * o.m[5],
                        0,
                        m[ 4] * o.m[3] + m[ 5] * o.m[7] + m[ 7],

                        0, 0, 1, 0,
                        0, 0, 0, 1,
                        Type(type | o.type)) ;
            }

        // Genereic full multiplication
        return mat4(m[ 0] * o.m[0] + m[ 1] * o.m[4] + m[ 2] * o.m[ 8] + m[ 3] * o.m[12],
                    m[ 0] * o.m[1] + m[ 1] * o.m[5] + m[ 2] * o.m[ 9] + m[ 3] * o.m[13],
                    m[ 0] * o.m[2] + m[ 1] * o.m[6] + m[ 2] * o.m[10] + m[ 3] * o.m[14],
                    m[ 0] * o.m[3] + m[ 1] * o.m[7] + m[ 2] * o.m[11] + m[ 3] * o.m[15],

                    m[ 4] * o.m[0] + m[ 5] * o.m[4] + m[ 6] * o.m[ 8] + m[ 7] * o.m[12],
                    m[ 4] * o.m[1] + m[ 5] * o.m[5] + m[ 6] * o.m[ 9] + m[ 7] * o.m[13],
                    m[ 4] * o.m[2] + m[ 5] * o.m[6] + m[ 6] * o.m[10] + m[ 7] * o.m[14],
                    m[ 4] * o.m[3] + m[ 5] * o.m[7] + m[ 6] * o.m[11] + m[ 7] * o.m[15],

                    m[ 8] * o.m[0] + m[ 9] * o.m[4] + m[10] * o.m[ 8] + m[11] * o.m[12],
                    m[ 8] * o.m[1] + m[ 9] * o.m[5] + m[10] * o.m[ 9] + m[11] * o.m[13],
                    m[ 8] * o.m[2] + m[ 9] * o.m[6] + m[10] * o.m[10] + m[11] * o.m[14],
                    m[ 8] * o.m[3] + m[ 9] * o.m[7] + m[10] * o.m[11] + m[11] * o.m[15],

                    m[12] * o.m[0] + m[13] * o.m[4] + m[14] * o.m[ 8] + m[15] * o.m[12],
                    m[12] * o.m[1] + m[13] * o.m[5] + m[14] * o.m[ 9] + m[15] * o.m[13],
                    m[12] * o.m[2] + m[13] * o.m[6] + m[14] * o.m[10] + m[15] * o.m[14],
                    m[12] * o.m[3] + m[13] * o.m[7] + m[14] * o.m[11] + m[15] * o.m[15],
                    Type(type | o.type)) ;
    }